

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::LazyStringOutputStream::Next
          (LazyStringOutputStream *this,void **data,int *size)

{
  ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *pRVar1;
  bool bVar2;
  string *psVar3;
  
  if (this->string_is_set_ == false) {
    pRVar1 = (this->callback_).ptr_;
    if (pRVar1 == (ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::ResultCallback<std::basic_string<char> *>>::operator->() const [C = google::protobuf::ResultCallback<std::basic_string<char> *>]"
                   );
    }
    psVar3 = (string *)(**(code **)(*(long *)pRVar1 + 0x10))();
    (this->super_StringOutputStream).target_ = psVar3;
    this->string_is_set_ = true;
  }
  bVar2 = StringOutputStream::Next(&this->super_StringOutputStream,data,size);
  return bVar2;
}

Assistant:

bool LazyStringOutputStream::Next(void** data, int* size) {
  if (!string_is_set_) {
    SetString(callback_->Run());
    string_is_set_ = true;
  }
  return StringOutputStream::Next(data, size);
}